

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index,int32_t s32Len)

{
  int iVar1;
  int iVar2;
  uint8_t *pSrc;
  uint8_t *pDest;
  uint32_t u32BytesRemain;
  int32_t s32ElemsRemain;
  int32_t i;
  int32_t s32Destination;
  int32_t s32Source;
  int32_t s32Len_local;
  int32_t s32Index_local;
  adt_ary_t *self_local;
  
  if ((self == (adt_ary_t *)0x0) || (s32Len < 1)) {
    self_local._7_1_ = '\x01';
  }
  else {
    if (s32Index < 0) {
      if (self->s32CurLen < -s32Index) {
        return '\x03';
      }
      s32Source = self->s32CurLen + s32Index;
    }
    else {
      s32Source = s32Index;
      if (self->s32CurLen <= s32Index) {
        return '\x03';
      }
    }
    iVar1 = s32Source + s32Len;
    if (self->s32CurLen < iVar1) {
      self_local._7_1_ = '\x04';
    }
    else {
      if (((self->destructorEnable & 1U) != 0) && (self->pDestructor != (_func_void_void_ptr *)0x0))
      {
        for (u32BytesRemain = 0; (int)u32BytesRemain < s32Len; u32BytesRemain = u32BytesRemain + 1)
        {
          (*self->pDestructor)(self->pFirst[(int)(s32Source + u32BytesRemain)]);
        }
      }
      iVar2 = self->s32CurLen - iVar1;
      if (0 < iVar2) {
        adt_block_memmove((uint8_t *)(self->pFirst + s32Source),(uint8_t *)(self->pFirst + iVar1),
                          iVar2 * 8);
      }
      self->s32CurLen = self->s32CurLen - s32Len;
      self_local._7_1_ = '\0';
    }
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index, int32_t s32Len){
   if ((self!=0) && (s32Len > 0)) {
      int32_t s32Source;
      int32_t s32Destination;
      int32_t i;
      int32_t s32ElemsRemain;


      if(s32Index<0){
         s32Index = (-s32Index);
         if(s32Index > (self->s32CurLen) ){
            return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
         s32Index=self->s32CurLen-s32Index;
      }
      else if(s32Index >= self->s32CurLen){
         return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
      }

      s32Destination = s32Index;
      s32Source = s32Index + s32Len;

      if (s32Source > self->s32CurLen) {
         return ADT_LENGTH_ERROR; //s32Len is too large
      }

      //call destructor on elements about to be removed
      if( (self->destructorEnable != 0) && (self->pDestructor != 0) ){
         for (i=0;i<s32Len; i++) {
            self->pDestructor(self->pFirst[s32Destination+i]);
         }
      }
      s32ElemsRemain = self->s32CurLen-s32Source;
      if (s32ElemsRemain > 0) {
         uint32_t u32BytesRemain;
         uint8_t* pDest;
         uint8_t* pSrc;
         pDest = (uint8_t*) &self->pFirst[s32Destination];
         pSrc = (uint8_t*) &self->pFirst[s32Source];
         u32BytesRemain = ((uint32_t)s32ElemsRemain) * ((uint32_t) ELEM_SIZE);
         adt_block_memmove(pDest, pSrc, u32BytesRemain);
      }
      self->s32CurLen-=s32Len;
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;

}